

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O3

void __thiscall polyscope::SurfaceCountQuantity::buildCustomUI(SurfaceCountQuantity *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined3 uVar2;
  float fVar3;
  bool bVar4;
  mapped_type *pmVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"##colormap_picker","");
  bVar4 = render::buildColormapSelector(&(this->colorMap).value,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (bVar4) {
    PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::manuallyChanged(&this->colorMap);
    pcVar1 = (this->colorMap).value._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (this->colorMap).value._M_string_length);
    PersistentValue<std::__cxx11::string>::operator=
              ((PersistentValue<std::__cxx11::string> *)&this->colorMap,&local_68);
    requestRedraw();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    this_00 = (this->program).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  ImGui::Text("Sum: %d",(ulong)(uint)this->sum);
  ImGui::DragFloatRange2
            ("Color Range",&this->vizRangeLow,&this->vizRangeHigh,
             (this->dataRangeHigh - this->dataRangeLow) / 100.0,this->dataRangeLow,
             this->dataRangeHigh,"Min: %.3e","Max: %.3e",1.0);
  bVar4 = ImGui::SliderFloat("Radius",&(this->pointRadius).value.value,0.0,0.1,"%.5f",3.0);
  if (bVar4) {
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&detail::persistentCache_scaledfloat,&(this->pointRadius).name);
    uVar2 = *(undefined3 *)&(this->pointRadius).value.field_0x1;
    fVar3 = (this->pointRadius).value.value;
    pmVar5->relativeFlag = (this->pointRadius).value.relativeFlag;
    *(undefined3 *)&pmVar5->field_0x1 = uVar2;
    pmVar5->value = fVar3;
    requestRedraw();
  }
  return;
}

Assistant:

void SurfaceCountQuantity::buildCustomUI() {

  if (render::buildColormapSelector(colorMap.get())) {
    colorMap.manuallyChanged();
    setColorMap(colorMap.get());
    program.reset();
  }
  ImGui::Text("Sum: %d", sum);

  ImGui::DragFloatRange2("Color Range", &vizRangeLow, &vizRangeHigh, (dataRangeHigh - dataRangeLow) / 100.,
                         dataRangeLow, dataRangeHigh, "Min: %.3e", "Max: %.3e");

  if (ImGui::SliderFloat("Radius", pointRadius.get().getValuePtr(), 0.0, .1, "%.5f", 3.)) {
    pointRadius.manuallyChanged();
    requestRedraw();
  }
}